

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* expectedUrls(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *__return_storage_ptr__,size_t size,string *url)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *url_local;
  size_t size_local;
  
  local_20 = url;
  url_local = (string *)size;
  size_local = (size_t)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_40,(string *)url);
  expectedValues<std::__cxx11::string>(__return_storage_ptr__,size,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> expectedUrls(size_t size, std::string url)
{
    return expectedValues<std::string>(size, url);
}